

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O3

double __thiscall
PyreNet::RandomGenerator::generate_gaussian(RandomGenerator *this,double mean,double std)

{
  result_type_conflict rVar1;
  undefined1 local_60 [8];
  normal_distribution<double> dist;
  unique_lock<std::mutex> lg;
  
  dist._24_8_ = instanceMutex;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&dist._M_saved_available);
  dist._M_param._M_stddev = 0.0;
  dist._M_saved._0_1_ = 0;
  local_60 = (undefined1  [8])mean;
  dist._M_param._M_mean = std;
  rVar1 = ::std::normal_distribution<double>::operator()
                    ((normal_distribution<double> *)local_60,this->generator,(param_type *)local_60)
  ;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&dist._M_saved_available);
  return rVar1;
}

Assistant:

double RandomGenerator::generate_gaussian(double mean, double std) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        std::normal_distribution<double> dist(mean, std);
        return dist(*generator);
    }